

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImPool<ImGuiTabBar>::Clear(ImPool<ImGuiTabBar> *this)

{
  int *piVar1;
  int iVar2;
  ImGuiTabBar *pIVar3;
  char *pcVar4;
  ImGuiTabItem *pIVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  if (0 < (this->Map).Data.Size) {
    lVar7 = 8;
    lVar8 = 0;
    do {
      iVar2 = *(int *)((long)&((this->Map).Data.Data)->key + lVar7);
      lVar6 = (long)iVar2;
      if (lVar6 != -1) {
        if ((this->Buf).Size <= iVar2) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                        ,0x52e,"T &ImVector<ImGuiTabBar>::operator[](int) [T = ImGuiTabBar]");
        }
        pIVar3 = (this->Buf).Data;
        pcVar4 = pIVar3[lVar6].TabsNames.Buf.Data;
        if (pcVar4 != (char *)0x0) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pcVar4,GImAllocatorUserData);
        }
        pIVar5 = pIVar3[lVar6].Tabs.Data;
        if (pIVar5 != (ImGuiTabItem *)0x0) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
        }
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar8 < (this->Map).Data.Size);
  }
  ImGuiStorage::Clear(&this->Map);
  pIVar3 = (this->Buf).Data;
  if (pIVar3 != (ImGuiTabBar *)0x0) {
    (this->Buf).Size = 0;
    (this->Buf).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    (this->Buf).Data = (ImGuiTabBar *)0x0;
  }
  this->FreeIdx = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Buf[idx].~T(); } Map.Clear(); Buf.clear(); FreeIdx = 0; }